

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_ptr.hpp
# Opt level: O2

value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> * __thiscall
nonstd::vptr::value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
operator=(value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *this,
         value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *rhs)

{
  reference v;
  
  if (this != rhs) {
    if ((rhs->ptr).ptr == (pointer)0x0) {
      detail::
      compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
      reset(&this->ptr,(pointer)0x0);
    }
    else {
      v = operator*(rhs);
      detail::
      compressed_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_>::
      reset(&this->ptr,v);
    }
  }
  return this;
}

Assistant:

value_ptr & operator=( value_ptr const & rhs )
    {
        if ( this == &rhs )
            return *this;

        if ( rhs ) ptr.reset( *rhs );
#if nsvp_HAVE_NULLPTR
        else       ptr.reset( nullptr );
#else
        else       ptr.reset( pointer(0) );
#endif
        return *this;
    }